

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionCosseratEasyRectangular::ChBeamSectionCosseratEasyRectangular
          (ChBeamSectionCosseratEasyRectangular *this,double width_y,double width_z,double E,
          double G,double density)

{
  shared_ptr<chrono::fea::ChInertiaCosseratSimple> minertia;
  shared_ptr<chrono::fea::ChElasticityCosseratSimple> melasticity;
  shared_ptr<chrono::fea::ChBeamSectionShapeRectangular> mdrawshape;
  __shared_ptr<chrono::fea::ChInertiaCosseratSimple,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<chrono::fea::ChElasticityCosseratSimple,_(__gnu_cxx::_Lock_policy)2> local_88;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  __shared_ptr<chrono::fea::ChBeamSectionShapeRectangular,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<chrono::fea::ChInertiaCosserat,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  __shared_ptr<chrono::fea::ChElasticityCosserat,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_78 = density;
  local_70 = E;
  local_68 = G;
  local_60 = width_z;
  local_58 = width_y;
  ChBeamSectionCosserat::ChBeamSectionCosserat(&this->super_ChBeamSectionCosserat);
  (this->super_ChBeamSectionCosserat).super_ChBeamSection._vptr_ChBeamSection =
       (_func_int **)&PTR__ChBeamSectionCosserat_01171ba0;
  std::make_shared<chrono::fea::ChElasticityCosseratSimple>();
  (local_88._M_ptr)->E = local_70;
  (local_88._M_ptr)->G = local_68;
  (*((local_88._M_ptr)->super_ChElasticityCosserat)._vptr_ChElasticityCosserat[4])(width_y,width_z);
  std::__shared_ptr<chrono::fea::ChElasticityCosserat,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChElasticityCosseratSimple,void>(local_20,&local_88);
  ChBeamSectionCosserat::SetElasticity
            (&this->super_ChBeamSectionCosserat,
             (shared_ptr<chrono::fea::ChElasticityCosserat> *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  std::make_shared<chrono::fea::ChInertiaCosseratSimple>();
  (*((local_98._M_ptr)->super_ChInertiaCosserat)._vptr_ChInertiaCosserat[0xb])
            (width_y,width_z,local_78);
  std::__shared_ptr<chrono::fea::ChInertiaCosserat,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChInertiaCosseratSimple,void>(local_30,&local_98);
  ChBeamSectionCosserat::SetInertia
            (&this->super_ChBeamSectionCosserat,
             (shared_ptr<chrono::fea::ChInertiaCosserat> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  std::make_shared<chrono::fea::ChBeamSectionShapeRectangular,double&,double&>
            ((double *)&local_50,&local_58);
  std::__shared_ptr<chrono::fea::ChBeamSectionShape,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChBeamSectionShapeRectangular,void>
            ((__shared_ptr<chrono::fea::ChBeamSectionShape,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             &local_50);
  std::__shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChBeamSectionCosserat).super_ChBeamSection.draw_shape.
              super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>,
             &local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  return;
}

Assistant:

ChBeamSectionCosseratEasyRectangular::ChBeamSectionCosseratEasyRectangular(
    double width_y,  // width of section in y direction
    double width_z,  // width of section in z direction
    double E,        // Young modulus
    double G,        // shear modulus
    double density   // volumetric density (ex. in SI units: [kg/m])
) {
    auto melasticity = chrono_types::make_shared<ChElasticityCosseratSimple>();
    melasticity->SetYoungModulus(E);
    melasticity->SetGshearModulus(G);
    melasticity->SetAsRectangularSection(width_y, width_z);
    this->SetElasticity(melasticity);

    auto minertia = chrono_types::make_shared<ChInertiaCosseratSimple>();
    minertia->SetAsRectangularSection(width_y, width_z, density);
    this->SetInertia(minertia);

    auto mdrawshape = chrono_types::make_shared<ChBeamSectionShapeRectangular>(width_y, width_z);
    this->SetDrawShape(mdrawshape);
}